

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O3

void __thiscall sc_core::vcd_trace_file::cycle(vcd_trace_file *this,bool this_is_a_delta_cycle)

{
  ostream *poVar1;
  ulong uVar2;
  pointer ppvVar3;
  vcd_trace *pvVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  sc_time *psVar9;
  sc_simcontext *this_00;
  unit_type extraout_RDX;
  unit_type tu;
  unit_type extraout_RDX_00;
  unit_type tu_00;
  undefined7 in_register_00000031;
  long lVar10;
  bool bVar11;
  unit_type now_units_low;
  unit_type now_units_high;
  stringstream ss;
  ulong local_1e8;
  string local_1e0;
  ulong local_1c0;
  undefined1 local_1b8 [392];
  
  if ((((int)CONCAT71(in_register_00000031,this_is_a_delta_cycle) == 0) ||
      ((this->super_sc_trace_file_base).trace_delta_cycles_ != false)) &&
     (bVar6 = sc_trace_file_base::initialize(&this->super_sc_trace_file_base), !bVar6)) {
    sc_trace_file_base::timestamp_in_trace_units
              (&this->super_sc_trace_file_base,&local_1c0,&local_1e8);
    bVar6 = local_1e8 <= this->previous_time_units_low;
    uVar2 = this->previous_time_units_high;
    bVar11 = local_1c0 != uVar2;
    bVar5 = local_1c0 <= uVar2;
    bVar7 = sc_trace_file_base::has_low_units(&this->super_sc_trace_file_base);
    tu_00 = extraout_RDX;
    if ((!bVar7) && (local_1e8 != 0)) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      poVar1 = (ostream *)(local_1b8 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tCurrent kernel time is ",0x19);
      psVar9 = sc_time_stamp();
      sc_time::print(psVar9,poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tVCD trace time unit is ",0x19);
      sc_trace_file_base::fs_unit_to_str_abi_cxx11_
                (&local_1e0,(sc_trace_file_base *)(this->super_sc_trace_file_base).trace_unit_fs,tu)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,
                 "\n\tUse \'tracefile->set_time_unit(double, sc_time_unit);\' to increase the time resolution."
                 ,0x58);
      std::__cxx11::stringbuf::str();
      sc_report_handler::report
                (SC_WARNING,"current kernel time is not representable in VCD time units",
                 local_1e0._M_dataplus._M_p,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/tracing/sc_vcd_trace.cpp"
                 ,0x7e4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      tu_00 = extraout_RDX_00;
    }
    if ((this->super_sc_trace_file_base).trace_delta_cycles_ == true) {
      if (!this_is_a_delta_cycle) {
        if ((bVar6 || bVar11) && bVar5) {
          return;
        }
        this->previous_time_units_high = local_1c0;
        this->previous_time_units_low = local_1e8;
        return;
      }
      if (cycle(bool)::warned == '\0') {
        sc_trace_file_base::fs_unit_to_str_abi_cxx11_
                  ((string *)local_1b8,
                   (sc_trace_file_base *)(this->super_sc_trace_file_base).trace_unit_fs,tu_00);
        sc_report_handler::report
                  (SC_INFO,"VCD delta cycle tracing with pseudo timesteps (1 unit)",
                   (char *)local_1b8._0_8_,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/tracing/sc_vcd_trace.cpp"
                   ,0x7ed);
        if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
          operator_delete((void *)local_1b8._0_8_);
        }
        cycle(bool)::warned = '\x01';
      }
      if (sc_curr_simcontext == (sc_simcontext *)0x0) {
        this_00 = (sc_simcontext *)operator_new(0x168);
        sc_simcontext::sc_simcontext(this_00);
        sc_curr_simcontext = this_00;
        sc_default_global_context = this_00;
      }
      if (((bVar6 || bVar11) && bVar5) &&
          sc_curr_simcontext->m_delta_count ==
          sc_curr_simcontext->m_initial_delta_count_at_current_time) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        poVar1 = (ostream *)(local_1b8 + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,"\n\tThis can occur when delta cycle tracing is activated.",0x37);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tSome delta cycles at ",0x17);
        psVar9 = sc_time_stamp();
        sc_time::print(psVar9,poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," are not shown in vcd.",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,
                   "\n\tUse \'tracefile->set_time_unit(double, sc_time_unit);\' to increase the time resolution."
                   ,0x58);
        std::__cxx11::stringbuf::str();
        sc_report_handler::report
                  (SC_WARNING,"tracing cycle with duplicate or reversed time detected",
                   local_1e0._M_dataplus._M_p,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/tracing/sc_vcd_trace.cpp"
                   ,0x7f7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        return;
      }
    }
    ppvVar3 = (this->traces).
              super__Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->traces).
                                super__Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar3) >> 3)) {
      lVar10 = 0;
      bVar6 = false;
      do {
        pvVar4 = ppvVar3[lVar10];
        iVar8 = (*pvVar4->_vptr_vcd_trace[2])(pvVar4);
        if ((char)iVar8 != '\0') {
          if (!bVar6) {
            print_time_stamp(this,local_1c0,local_1e8);
            bVar6 = true;
          }
          (**pvVar4->_vptr_vcd_trace)(pvVar4,(this->super_sc_trace_file_base).fp);
          fputc(10,(FILE *)(this->super_sc_trace_file_base).fp);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < (int)((ulong)((long)(this->traces).
                                            super__Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->traces).
                                           super__Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3));
      if (bVar6) {
        fputc(10,(FILE *)(this->super_sc_trace_file_base).fp);
      }
    }
  }
  return;
}

Assistant:

void
vcd_trace_file::cycle(bool this_is_a_delta_cycle)
{
    // Trace delta cycles only when enabled
    if (!delta_cycles() && this_is_a_delta_cycle) return;

    // Check for initialization
    if( initialize() )
        return;

    unit_type now_units_high, now_units_low;

    bool time_advanced = get_time_stamp(now_units_high, now_units_low);

    if (!has_low_units() && (now_units_low != 0)) {
        std::stringstream ss;
        ss << "\n\tCurrent kernel time is " << sc_time_stamp();
        ss << "\n\tVCD trace time unit is " << fs_unit_to_str(trace_unit_fs);
        ss << "\n\tUse 'tracefile->set_time_unit(double, sc_time_unit);' to increase the time resolution.";
        SC_REPORT_WARNING( SC_ID_TRACING_VCD_TIME_RESOLUTION_, ss.str().c_str() );
    }

    if (delta_cycles()) {

        if(this_is_a_delta_cycle) {
            static bool warned = false;
            if(!warned){
                SC_REPORT_INFO( SC_ID_TRACING_VCD_DELTA_CYCLE_
                , fs_unit_to_str(trace_unit_fs).c_str() );
                warned = true;
            }

            if (sc_delta_count_at_current_time() == 0) {
                if(!time_advanced) {
                    std::stringstream ss;
                    ss <<"\n\tThis can occur when delta cycle tracing is activated."
                       <<"\n\tSome delta cycles at " << sc_time_stamp() << " are not shown in vcd."
                       <<"\n\tUse 'tracefile->set_time_unit(double, sc_time_unit);' to increase the time resolution.";
                    SC_REPORT_WARNING( SC_ID_TRACING_REVERSED_TIME_, ss.str().c_str() );

                    return;
                }
            }
        }

        if (!this_is_a_delta_cycle) {
            if (time_advanced) {
                previous_time_units_high = now_units_high;
                previous_time_units_low = now_units_low;
            }
            // Value updates can't happen during timed notification
            // so it is safe to skip printing
            return;
        }
    }

    // Now do the actual printing
    bool time_printed = false;
    vcd_trace* const* const l_traces = &traces[0];
    for (int i = 0; i < (int)traces.size(); i++) {
        vcd_trace* t = l_traces[i];
        if(t->changed()) {
            if(!time_printed){
                print_time_stamp(now_units_high, now_units_low);

                time_printed = true;
            }

            // Write the variable
            t->write(fp);
            std::fputc('\n', fp);
        }
    }
    // Put another newline after all values are printed
    if(time_printed) std::fputc('\n', fp);
}